

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O3

void __thiscall rsg::VariableManager::popVariableScope(VariableManager *this)

{
  pointer ppVVar1;
  VariableScope *pVVar2;
  long lVar3;
  iterator __position;
  pointer ppVVar4;
  pointer ppVVar5;
  ulong uVar6;
  Variable *liveVar;
  Variable *local_30;
  
  ppVVar1 = (this->m_variableScopeStack).
            super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppVVar4 = (this->m_variableScopeStack).
            super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar6 = (long)ppVVar4 - (long)ppVVar1;
  if (8 < uVar6) {
    pVVar2 = ppVVar4[-1];
    ppVVar5 = (pVVar2->m_liveVariables).
              super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((pVVar2->m_liveVariables).
        super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
        super__Vector_impl_data._M_start != ppVVar5) {
      lVar3 = *(long *)((long)ppVVar1 + (uVar6 - 0x10));
      do {
        local_30 = ppVVar5[-1];
        __position._M_current = *(Variable ***)(lVar3 + 0x20);
        if (__position._M_current == *(Variable ***)(lVar3 + 0x28)) {
          std::vector<rsg::Variable*,std::allocator<rsg::Variable*>>::
          _M_realloc_insert<rsg::Variable*const&>
                    ((vector<rsg::Variable*,std::allocator<rsg::Variable*>> *)(lVar3 + 0x18),
                     __position,&local_30);
        }
        else {
          *__position._M_current = local_30;
          *(long *)(lVar3 + 0x20) = *(long *)(lVar3 + 0x20) + 8;
        }
        ppVVar5 = (pVVar2->m_liveVariables).
                  super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
        (pVVar2->m_liveVariables).
        super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppVVar5;
      } while ((pVVar2->m_liveVariables).
               super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
               super__Vector_impl_data._M_start != ppVVar5);
      ppVVar4 = (this->m_variableScopeStack).
                super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  (this->m_variableScopeStack).
  super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppVVar4 + -1;
  return;
}

Assistant:

void VariableManager::popVariableScope (void)
{
	VariableScope& curScope = getCurVariableScope();

	// Migrate live variables to parent scope.
	// Variables allocated in child scopes can be declared in any parent scope but not the other way around.
	if (m_variableScopeStack.size() > 1)
	{
		VariableScope&		parentScope		= *m_variableScopeStack[m_variableScopeStack.size()-2];
		vector<Variable*>&	curLiveVars		= curScope.getLiveVariables();
		vector<Variable*>&	parenLiveVars	= parentScope.getLiveVariables();

		while (!curLiveVars.empty())
		{
			Variable* liveVar = curLiveVars.back();
			parenLiveVars.push_back(liveVar);
			curLiveVars.pop_back();
		}
	}

	// All variables should be either migrated to parent or declared (in case of root scope).
	DE_ASSERT(curScope.getLiveVariables().size() == 0);

	m_variableScopeStack.pop_back();
}